

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree *
capnp::operator*(StringTree *__return_storage_ptr__,undefined8 param_2,undefined2 param_3)

{
  DynamicEnum value;
  undefined4 uStack_80;
  Reader local_70;
  undefined8 uStack_28;
  DynamicEnum value_local;
  
  uStack_80 = (undefined4)CONCAT62(value_local.schema.super_Schema.raw._2_6_,param_3);
  value._8_4_ = uStack_80;
  value.schema.super_Schema.raw = (Schema)(Schema)param_2;
  value._12_4_ = 0;
  uStack_28 = param_2;
  value_local.schema.super_Schema.raw._0_2_ = param_3;
  DynamicValue::Reader::Reader(&local_70,value);
  anon_unknown_2::stringify(__return_storage_ptr__,&local_70);
  DynamicValue::Reader::~Reader(&local_70);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(DynamicEnum value) { return stringify(value); }